

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O2

void __thiscall
tchecker::details::
rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
::compile_ite_expression
          (rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
           *this,typed_expression_t *cond,typed_expression_t *then_value,
          typed_expression_t *else_value)

{
  size_type sVar1;
  size_type sVar2;
  back_insert_iterator<std::vector<long,_std::allocator<long>_>_> *this_00;
  vector<long,_std::allocator<long>_> else_bytecode;
  vector<long,_std::allocator<long>_> then_bytecode;
  size_type local_90;
  _Vector_base<long,_std::allocator<long>_> local_88;
  _Vector_base<long,_std::allocator<long>_> local_68;
  _Vector_base<long,_std::allocator<long>_> local_50;
  _Vector_base<long,_std::allocator<long>_> local_38;
  
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar1 = compile_tmp_rvalue_expression(then_value,(vector<long,_std::allocator<long>_> *)&local_68)
  ;
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar2 = compile_tmp_rvalue_expression(else_value,(vector<long,_std::allocator<long>_> *)&local_88)
  ;
  (**(code **)(*(long *)cond + 0x30))(cond,this);
  local_90 = 4;
  this_00 = &this->_bytecode_back_inserter;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (this_00,(value_type_conflict3 *)&local_90);
  local_90 = sVar1 + 2;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (this_00,(value_type_conflict3 *)&local_90);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&local_38,
             (vector<long,_std::allocator<long>_> *)&local_68);
  append_bytecode<std::back_insert_iterator<std::vector<long,std::allocator<long>>>>
            (this_00,(vector<long,_std::allocator<long>_> *)&local_38);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_38);
  local_90 = 3;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (this_00,(value_type_conflict3 *)&local_90);
  local_90 = sVar2;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (this_00,(value_type_conflict3 *)&local_90);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&local_50,
             (vector<long,_std::allocator<long>_> *)&local_88);
  append_bytecode<std::back_insert_iterator<std::vector<long,std::allocator<long>>>>
            (this_00,(vector<long,_std::allocator<long>_> *)&local_50);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_50);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_88);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_68);
  return;
}

Assistant:

void compile_ite_expression(tchecker::typed_expression_t const & cond, tchecker::typed_expression_t const & then_value,
                              tchecker::typed_expression_t const & else_value)
  {
    // pre-compute 'then' and 'else' bytecodes
    std::vector<tchecker::bytecode_t> then_bytecode;
    auto then_len = compile_tmp_rvalue_expression(then_value, then_bytecode);

    std::vector<tchecker::bytecode_t> else_bytecode;
    auto else_len = compile_tmp_rvalue_expression(else_value, else_bytecode);

    // generation of ite bytecode
    //  - insert guard bytecode
    cond.visit(*this);

    //  - insert a conditional jump over 'then' bytecode. Jump instruction
    //    move IP relatively to the address following the JMP.
    _bytecode_back_inserter = tchecker::VM_JMPZ;
    _bytecode_back_inserter = then_len + 2;

    //  - insert bytecode for the 'then' statement
    append_bytecode(_bytecode_back_inserter, then_bytecode);

    //  - insert a jump over 'else' bytecode.
    _bytecode_back_inserter = tchecker::VM_JMP;
    _bytecode_back_inserter = else_len;

    //  - insert bytecode for the 'else' statement
    append_bytecode(_bytecode_back_inserter, else_bytecode);
  }